

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linuxaio_queue.cpp
# Opt level: O3

void __thiscall foxxll::linuxaio_queue::wait_requests(linuxaio_queue *this)

{
  int iVar1;
  value_type vVar2;
  __pid_t _Var3;
  io_event *events;
  long num_events;
  int *piVar4;
  ostream *poVar5;
  char *pcVar6;
  io_error *this_00;
  __sighandler_t __handler;
  aio_context_t aVar7;
  ulong uVar8;
  ostringstream msg;
  string local_1c8;
  unique_lock<std::mutex> local_1a8 [23];
  
  iVar1 = this->max_events_;
  if ((long)iVar1 == 0) {
    events = (io_event *)0x0;
  }
  else {
    uVar8 = 0xffffffffffffffff;
    if (-1 < iVar1) {
      uVar8 = (long)iVar1 << 5;
    }
    events = (io_event *)operator_new__(uVar8);
  }
  while( true ) {
    _Var3 = tlx::Semaphore::wait(&this->num_posted_requests_,(void *)0x1);
    local_1a8[0]._M_owns = false;
    local_1a8[0]._M_device = &(this->wait_thread_state_).mutex_;
    std::unique_lock<std::mutex>::lock(local_1a8);
    local_1a8[0]._M_owns = true;
    vVar2 = (this->wait_thread_state_).state_;
    std::unique_lock<std::mutex>::~unique_lock(local_1a8);
    if ((_Var3 == 0) && (vVar2 == TERMINATING)) break;
    while( true ) {
      aVar7 = this->context_;
      num_events = syscall(0xd0,aVar7,1,(ulong)(uint)this->max_events_,events,0);
      if (-1 < num_events) break;
      piVar4 = __errno_location();
      if (*piVar4 != 4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Error in ",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"void foxxll::linuxaio_queue::wait_requests()",0x2c);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," : ",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"linuxaio_queue::wait_requests io_getevents() nr_events=",
                   0x37);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,this->max_events_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," : ",3);
        pcVar6 = strerror(*piVar4);
        std::operator<<(poVar5,pcVar6);
        this_00 = (io_error *)__cxa_allocate_exception(0x20);
        std::__cxx11::stringbuf::str();
        io_error::io_error(this_00,&local_1c8);
        __cxa_throw(this_00,&io_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
      }
    }
    tlx::Semaphore::signal(&this->num_posted_requests_,(int)aVar7,__handler);
    handle_events(this,events,num_events,false);
  }
  if (events != (io_event *)0x0) {
    operator_delete__(events);
  }
  return;
}

Assistant:

void linuxaio_queue::wait_requests()
{
    tlx::simple_vector<io_event> events(max_events_);

    for ( ; ; ) // as long as thread is running
    {
        // might block until next request is posted or message comes in
        int num_currently_posted_requests = num_posted_requests_.wait();

        // terminate if termination has been requested
        if (wait_thread_state_() == TERMINATING &&
            num_currently_posted_requests == 0)
            break;

        // wait for at least one of them to finish
        long num_events;
        while (1) {
            num_events = syscall(
                    SYS_io_getevents, context_, 1,
                    max_events_, events.data(), nullptr
                );

            if (num_events < 0) {
                if (errno == EINTR) {
                    // io_getevents may return prematurely in case a signal is
                    // received
                    continue;
                }

                FOXXLL_THROW_ERRNO(
                    io_error, "linuxaio_queue::wait_requests"
                    " io_getevents() nr_events=" << max_events_
                );
            }
            break;
        }

        // compensate for the one eaten prematurely above
        num_posted_requests_.signal();

        handle_events(events.data(), num_events, false);
    }
}